

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall leveldb::DestroyDB(leveldb *this,string *dbname,Options *options)

{
  Env *pEVar1;
  Status SVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  Status del;
  FileType type;
  uint64_t number;
  FileLock *lock;
  Status result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  string lockname;
  Status local_f8;
  Status local_f0;
  Status local_e8;
  Status local_e0;
  FileType local_d4;
  uint64_t local_d0;
  undefined8 local_c8;
  Status local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pEVar1 = options->env;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*pEVar1->_vptr_Env[7])(&local_c0,pEVar1,dbname);
  if (local_c0.state_ == (char *)0x0) {
    LockFileName(&local_58,dbname);
    (*pEVar1->_vptr_Env[0xd])(&local_78,pEVar1,&local_58,&local_c8);
    SVar2.state_ = local_c0.state_;
    local_c0.state_ = local_78._M_dataplus._M_p;
    local_78._M_dataplus._M_p = SVar2.state_;
    Status::~Status((Status *)&local_78);
    if (local_c0.state_ == (char *)0x0) {
      lVar4 = 0;
      for (uVar5 = 0;
          uVar5 < (ulong)((long)local_b8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_b8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5); uVar5 = uVar5 + 1)
      {
        bVar3 = ParseFileName((string *)
                              ((long)&((local_b8.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar4),&local_d0,&local_d4);
        if (bVar3 && local_d4 != kDBLockFile) {
          std::operator+(&local_98,dbname,"/");
          std::operator+(&local_78,&local_98,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((local_b8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar4));
          (*pEVar1->_vptr_Env[8])(&local_e0,pEVar1,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_98);
          if ((local_c0.state_ == (char *)0x0) && (local_e0.state_ != (char *)0x0)) {
            Status::operator=(&local_c0,&local_e0);
          }
          Status::~Status(&local_e0);
        }
        lVar4 = lVar4 + 0x20;
      }
      (*pEVar1->_vptr_Env[0xe])(&local_e8,pEVar1,local_c8);
      Status::~Status(&local_e8);
      (*pEVar1->_vptr_Env[8])(&local_f0,pEVar1,&local_58);
      Status::~Status(&local_f0);
      (*pEVar1->_vptr_Env[10])(&local_f8,pEVar1,dbname);
      Status::~Status(&local_f8);
    }
    *(char **)this = local_c0.state_;
    local_c0.state_ = (char *)0x0;
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    *(undefined8 *)this = 0;
  }
  Status::~Status(&local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status DestroyDB(const std::string& dbname, const Options& options) {
  Env* env = options.env;
  std::vector<std::string> filenames;
  Status result = env->GetChildren(dbname, &filenames);
  if (!result.ok()) {
    // Ignore error in case directory does not exist
    return Status::OK();
  }

  FileLock* lock;
  const std::string lockname = LockFileName(dbname);
  result = env->LockFile(lockname, &lock);
  if (result.ok()) {
    uint64_t number;
    FileType type;
    for (size_t i = 0; i < filenames.size(); i++) {
      if (ParseFileName(filenames[i], &number, &type) &&
          type != kDBLockFile) {  // Lock file will be deleted at end
        Status del = env->DeleteFile(dbname + "/" + filenames[i]);
        if (result.ok() && !del.ok()) {
          result = del;
        }
      }
    }
    env->UnlockFile(lock);  // Ignore error since state is already gone
    env->DeleteFile(lockname);
    env->DeleteDir(dbname);  // Ignore error in case dir contains other files
  }
  return result;
}